

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall CLI::Option::excludes(Option *this,Option *opt)

{
  IncorrectConstruction *this_00;
  Option *local_50;
  Option *opt_local;
  string local_40;
  
  opt_local = opt;
  if (opt != this) {
    ::std::
    _Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
    ::_M_insert_unique<CLI::Option*const&>
              ((_Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
                *)&this->excludes_,&opt_local);
    local_50 = this;
    ::std::
    _Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
    ::_M_insert_unique<CLI::Option*>
              ((_Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
                *)&opt_local->excludes_,&local_50);
    return this;
  }
  this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"and option cannot exclude itself",(allocator<char> *)&local_50);
  IncorrectConstruction::IncorrectConstruction(this_00,&local_40);
  __cxa_throw(this_00,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

CLI11_INLINE Option *Option::excludes(Option *opt) {
    if(opt == this) {
        throw(IncorrectConstruction("and option cannot exclude itself"));
    }
    excludes_.insert(opt);

    // Help text should be symmetric - excluding a should exclude b
    opt->excludes_.insert(this);

    // Ignoring the insert return value, excluding twice is now allowed.
    // (Mostly to allow both directions to be excluded by user, even though the library does it for you.)

    return this;
}